

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

void __thiscall Memory::HeapInfo::Verify(HeapInfo *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar5;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar6;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_01;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock_9;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  long lVar7;
  undefined8 *in_FS_OFFSET;
  
  BVar4 = Recycler::CollectionInProgress(this->recycler);
  if (BVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x741,"(!this->recycler->CollectionInProgress())",
                       "!this->recycler->CollectionInProgress()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  lVar7 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::Verify
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar7));
    lVar7 = lVar7 + 0x380;
  } while (lVar7 != 0xa878);
  lVar7 = 0;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::Verify
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&this->mediumHeapBuckets[0].heapBucket.
                       super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .
                       super_HeapBucketT<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                       .super_HeapBucket.heapInfo + lVar7));
    lVar7 = lVar7 + 0x380;
  } while (lVar7 != 0x6580);
  LargeHeapBucket::Verify(&this->largeObjectBucket);
  for (pSVar5 = &this->newLeafHeapBlockList->super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
      pSVar5 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar5 = &HeapBlock::AsLeafBlock<SmallAllocationBlockAttributes>
                          (&pSVar5->next->super_HeapBlock)->
                super_SmallHeapBlockT<SmallAllocationBlockAttributes>) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify(pSVar5,false);
    if (pSVar5->next == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar5 = &this->newNormalHeapBlockList->super_SmallHeapBlockT<SmallAllocationBlockAttributes>
      ; pSVar5 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar5 = &HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>
                          (&pSVar5->next->super_HeapBlock)->
                super_SmallHeapBlockT<SmallAllocationBlockAttributes>) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify(pSVar5,false);
    if (pSVar5->next == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                this->newNormalWithBarrierHeapBlockList;
      pSVar5 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
               HeapBlock::AsNormalWriteBarrierBlock<SmallAllocationBlockAttributes>
                         (&pSVar5->next->super_HeapBlock)) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify(pSVar5,false);
    if (pSVar5->next == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
                this->newFinalizableWithBarrierHeapBlockList;
      pSVar5 != (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar5 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)
               HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                         (&pSVar5->next->super_HeapBlock)) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify(pSVar5,false);
    if (pSVar5->next == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
  }
  this_00 = this->newFinalizableHeapBlockList;
  while (this_00 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallHeapBlockT<SmallAllocationBlockAttributes>::Verify
              ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this_00,false);
    pSVar5 = (this_00->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar5 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
    this_00 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                        (&pSVar5->super_HeapBlock);
  }
  for (pSVar6 = &this->newMediumLeafHeapBlockList->
                 super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      pSVar6 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar6 = &HeapBlock::AsLeafBlock<MediumAllocationBlockAttributes>
                          (&pSVar6->next->super_HeapBlock)->
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(pSVar6,false);
    if (pSVar6->next == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar6 = &this->newMediumNormalHeapBlockList->
                 super_SmallHeapBlockT<MediumAllocationBlockAttributes>;
      pSVar6 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar6 = &HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>
                          (&pSVar6->next->super_HeapBlock)->
                super_SmallHeapBlockT<MediumAllocationBlockAttributes>) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(pSVar6,false);
    if (pSVar6->next == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar6 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                this->newMediumNormalWithBarrierHeapBlockList;
      pSVar6 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar6 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
               HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&pSVar6->next->super_HeapBlock)) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(pSVar6,false);
    if (pSVar6->next == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
  }
  for (pSVar6 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                this->newMediumFinalizableWithBarrierHeapBlockList;
      pSVar6 != (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
      pSVar6 = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
               HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&pSVar6->next->super_HeapBlock)) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(pSVar6,false);
    if (pSVar6->next == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
  }
  this_01 = this->newMediumFinalizableHeapBlockList;
  while( true ) {
    if (this_01 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      return;
    }
    SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify
              ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this_01,false);
    pSVar6 = (this_01->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar6 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
    this_01 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                        (&pSVar6->super_HeapBlock);
  }
  return;
}

Assistant:

void
HeapInfo::Verify()
{
    Assert(!this->recycler->CollectionInProgress());
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].Verify();
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].Verify();
    }
#endif

    largeObjectBucket.Verify();

#if ENABLE_CONCURRENT_GC
    HeapBlockList::ForEach(newLeafHeapBlockList, [](SmallLeafHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
    HeapBlockList::ForEach(newNormalHeapBlockList, [](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
#ifdef RECYCLER_VISITED_HOST
    HeapBlockList::ForEach(newRecyclerVisitedHostHeapBlockList, [](SmallFinalizableHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
    HeapBlockList::ForEach(newFinalizableHeapBlockList, [](SmallFinalizableHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif

#if ENABLE_CONCURRENT_GC
    HeapBlockList::ForEach(newMediumLeafHeapBlockList, [](MediumLeafHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
#ifdef RECYCLER_VISITED_HOST
    HeapBlockList::ForEach(newMediumRecyclerVisitedHostHeapBlockList, [](MediumFinalizableHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [](MediumFinalizableHeapBlock * heapBlock)
    {
        heapBlock->Verify();
    });
#endif
}